

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

VkResult __thiscall
VmaDefragmentationContext_T::DefragmentPassBegin
          (VmaDefragmentationContext_T *this,VmaDefragmentationPassMoveInfo *moveInfo)

{
  uint32_t uVar1;
  ulong uVar2;
  bool bVar3;
  VmaBlockVector **ppVVar4;
  VmaDefragmentationMove *pVVar5;
  VmaBlockVector *pVVar6;
  uint32_t i;
  ulong uVar7;
  VmaMutexLockWrite lock;
  VmaMutexLockWrite local_28;
  
  pVVar6 = this->m_PoolBlockVector;
  if (pVVar6 == (VmaBlockVector *)0x0) {
    for (uVar7 = 0; uVar7 < this->m_BlockVectorCount; uVar7 = uVar7 + 1) {
      ppVVar4 = this->m_pBlockVectors;
      pVVar6 = ppVVar4[uVar7];
      if (pVVar6 != (VmaBlockVector *)0x0) {
        bVar3 = pVVar6->m_hAllocator->m_UseMutex;
        local_28.m_pMutex = (VmaRWMutex *)0x0;
        if (bVar3 != false) {
          local_28.m_pMutex = &pVVar6->m_Mutex;
        }
        if (bVar3 == true) {
          std::__shared_mutex_pthread::lock((__shared_mutex_pthread *)&pVVar6->m_Mutex);
          ppVVar4 = this->m_pBlockVectors;
        }
        pVVar6 = ppVVar4[uVar7];
        uVar2 = (pVVar6->m_Blocks).m_Count;
        if (uVar2 < 2) {
          if (uVar2 == 1) {
            bVar3 = ReallocWithinBlock(this,pVVar6,*(pVVar6->m_Blocks).m_pArray);
            goto LAB_001a7903;
          }
        }
        else {
          bVar3 = ComputeDefragmentation(this,pVVar6,uVar7);
LAB_001a7903:
          if (bVar3 != false) goto LAB_001a792f;
        }
        VmaMutexLockWrite::~VmaMutexLockWrite(&local_28);
      }
    }
  }
  else {
    bVar3 = pVVar6->m_hAllocator->m_UseMutex;
    local_28.m_pMutex = (VmaRWMutex *)0x0;
    if (bVar3 != false) {
      local_28.m_pMutex = &pVVar6->m_Mutex;
    }
    if (bVar3 == true) {
      std::__shared_mutex_pthread::lock((__shared_mutex_pthread *)&pVVar6->m_Mutex);
      pVVar6 = this->m_PoolBlockVector;
    }
    uVar7 = (pVVar6->m_Blocks).m_Count;
    if (uVar7 < 2) {
      if (uVar7 == 1) {
        ReallocWithinBlock(this,pVVar6,*(pVVar6->m_Blocks).m_pArray);
      }
    }
    else {
      ComputeDefragmentation(this,pVVar6,0);
    }
LAB_001a792f:
    VmaMutexLockWrite::~VmaMutexLockWrite(&local_28);
  }
  uVar1 = (uint32_t)(this->m_Moves).m_Count;
  moveInfo->moveCount = uVar1;
  if (uVar1 == 0) {
    pVVar5 = (VmaDefragmentationMove *)0x0;
  }
  else {
    pVVar5 = (this->m_Moves).m_pArray;
  }
  moveInfo->pMoves = pVVar5;
  return (uint)(uVar1 != 0) * 5;
}

Assistant:

VkResult VmaDefragmentationContext_T::DefragmentPassBegin(VmaDefragmentationPassMoveInfo& moveInfo)
{
    if (m_PoolBlockVector != VMA_NULL)
    {
        VmaMutexLockWrite lock(m_PoolBlockVector->GetMutex(), m_PoolBlockVector->GetAllocator()->m_UseMutex);

        if (m_PoolBlockVector->GetBlockCount() > 1)
            ComputeDefragmentation(*m_PoolBlockVector, 0);
        else if (m_PoolBlockVector->GetBlockCount() == 1)
            ReallocWithinBlock(*m_PoolBlockVector, m_PoolBlockVector->GetBlock(0));
    }
    else
    {
        for (uint32_t i = 0; i < m_BlockVectorCount; ++i)
        {
            if (m_pBlockVectors[i] != VMA_NULL)
            {
                VmaMutexLockWrite lock(m_pBlockVectors[i]->GetMutex(), m_pBlockVectors[i]->GetAllocator()->m_UseMutex);

                if (m_pBlockVectors[i]->GetBlockCount() > 1)
                {
                    if (ComputeDefragmentation(*m_pBlockVectors[i], i))
                        break;
                }
                else if (m_pBlockVectors[i]->GetBlockCount() == 1)
                {
                    if (ReallocWithinBlock(*m_pBlockVectors[i], m_pBlockVectors[i]->GetBlock(0)))
                        break;
                }
            }
        }
    }

    moveInfo.moveCount = static_cast<uint32_t>(m_Moves.size());
    if (moveInfo.moveCount > 0)
    {
        moveInfo.pMoves = m_Moves.data();
        return VK_INCOMPLETE;
    }

    moveInfo.pMoves = VMA_NULL;
    return VK_SUCCESS;
}